

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ClassType * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ClassType,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2)

{
  SourceLocation SVar1;
  size_t sVar2;
  char *pcVar3;
  ClassType *thisSym_;
  
  thisSym_ = (ClassType *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ClassType *)this->endPtr < thisSym_ + 1) {
    thisSym_ = (ClassType *)allocateSlow(this,200,8);
  }
  else {
    this->head->current = (byte *)(thisSym_ + 1);
  }
  sVar2 = args_1->_M_len;
  pcVar3 = args_1->_M_str;
  SVar1 = *args_2;
  (thisSym_->super_Type).super_Symbol.kind = ClassType;
  (thisSym_->super_Type).super_Symbol.name._M_len = sVar2;
  (thisSym_->super_Type).super_Symbol.name._M_str = pcVar3;
  (thisSym_->super_Type).super_Symbol.location = SVar1;
  (thisSym_->super_Type).super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (thisSym_->super_Type).super_Symbol.parentScope = (Scope *)0x0;
  (thisSym_->super_Type).super_Symbol.nextInScope = (Symbol *)0x0;
  (thisSym_->super_Type).super_Symbol.indexInScope = 0;
  (thisSym_->super_Type).canonical = &thisSym_->super_Type;
  ast::Scope::Scope(&thisSym_->super_Scope,args,(Symbol *)thisSym_);
  thisSym_->genericClass = (GenericClassDefSymbol *)0x0;
  thisSym_->isAbstract = false;
  thisSym_->isInterface = false;
  (thisSym_->baseConstructorCall).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
  _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged = false;
  thisSym_->baseClass = (Type *)0x0;
  thisSym_->baseConstructor = (Symbol *)0x0;
  thisSym_->firstForward = (ForwardingTypedefSymbol *)0x0;
  (thisSym_->implementsIfaces).data_ = (pointer)0x0;
  (thisSym_->implementsIfaces).size_ = 0;
  return thisSym_;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }